

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O1

void __thiscall
BBDT<UFPC>::PerformLabelingMem
          (BBDT<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer piVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_300 [104];
  Mat local_298 [16];
  long local_288;
  long *local_250;
  undefined1 local_238 [104];
  Mat local_1d0 [16];
  long local_1c0;
  long *local_188;
  ulong local_170;
  ulong local_168;
  BBDT<UFPC> *local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_158;
  long *local_150;
  long local_148;
  long *local_140;
  long local_138;
  pointer local_130;
  pointer local_128;
  long local_120;
  long local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar8 = *(uint *)&pMVar4->field_0x8;
  local_170 = (ulong)uVar8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar12 = (long)iVar3;
  UFPC::MemAlloc(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                 ((int)((uVar8 - ((int)(uVar8 + 1) >> 0x1f)) + 1) >> 1) + 1);
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_238,(Mat_<unsigned_char> *)local_90);
  local_158 = accesses;
  cv::Mat::~Mat(local_90);
  uVar23 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar23 << 0x20 | uVar23 >> 0x20);
  local_160 = this;
  MemMat<int>::MemMat((MemMat<int> *)local_300,&local_110,0);
  if (0 < (int)local_170) {
    uVar23 = 0;
    do {
      if (0 < iVar3) {
        lVar15 = uVar23 - 1;
        lVar21 = uVar23 - 2;
        uVar22 = uVar23 | 1;
        uVar20 = 0;
        do {
          lVar10 = *local_188;
          lVar16 = lVar10 * uVar23 + local_1c0;
          piVar1 = (int *)(lVar16 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          lVar13 = *(long *)local_238._80_8_;
          lVar17 = lVar13 * uVar23 + local_238._24_8_;
          if (*(char *)(uVar20 + lVar17) == '\0') {
            if (uVar22 < local_170) {
              lVar18 = lVar10 * uVar22 + local_1c0;
              piVar1 = (int *)(lVar18 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = lVar13 * uVar22 + local_238._24_8_;
              if (*(char *)(uVar20 + lVar19) == '\0') goto LAB_0018a22c;
              uVar9 = uVar20 | 1;
              if (((long)uVar9 < lVar12) &&
                 (piVar1 = (int *)(lVar16 + uVar9 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar17 + uVar9) != '\0')) {
                if (uVar20 == 0) {
LAB_0018b0d5:
                  if ((uVar23 == 0) ||
                     (piVar1 = (int *)(lVar10 * lVar15 + local_1c0 + uVar9 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(uVar9 + lVar13 * lVar15 + local_238._24_8_) == '\0')) {
                    if ((long)(uVar20 + 2) < lVar12) {
                      if (uVar23 == 0) goto LAB_0018b577;
                      lVar16 = lVar10 * lVar15 + local_1c0;
                      piVar1 = (int *)(lVar16 + 8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar17 = lVar13 * lVar15 + local_238._24_8_;
                      if (*(char *)(uVar20 + 2 + lVar17) == '\0') goto LAB_0018b514;
                      piVar1 = (int *)(lVar16 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar17 + uVar20) == '\0') {
                        lVar10 = *local_250;
                        piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar13 = *(long *)local_300._80_8_;
                      }
                      else {
                        piVar1 = (int *)(local_1c0 + lVar10 * lVar21 + uVar9 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar9 + local_238._24_8_ + lVar13 * lVar21) == '\0') {
                          lVar10 = *local_250 * lVar21 + local_288;
                          piVar1 = (int *)(lVar10 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar13 = *(long *)local_300._80_8_ * lVar21 + local_300._24_8_;
                          uVar8 = *(uint *)(lVar13 + uVar20 * 4);
                          piVar1 = (int *)(lVar10 + 8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar14 = *(uint *)(lVar13 + 8 + uVar20 * 4);
                          goto LAB_0018bc19;
                        }
                        lVar10 = *local_250;
                        piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar13 = *(long *)local_300._80_8_;
                      }
                      uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + 8 + uVar20 * 4);
                    }
                    else {
LAB_0018b514:
                      if ((uVar23 == 0) ||
                         (piVar1 = (int *)(local_1c0 + lVar10 * lVar15 + uVar20 * 4),
                         *piVar1 = *piVar1 + 1,
                         *(char *)(uVar20 + local_238._24_8_ + lVar13 * lVar15) == '\0')) {
LAB_0018b577:
                        uVar8 = UFPC::length_;
                        lVar10 = (long)(int)UFPC::length_;
                        UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar10] =
                             UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar10] + 1;
                        UFPC::mem_P_.vec_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10] = uVar8;
                        uVar8 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                        goto LAB_0018b5a4;
                      }
                      lVar10 = *local_250;
                      piVar1 = (int *)(lVar10 * lVar21 + local_288 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar13 = *(long *)local_300._80_8_;
                      uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + uVar20 * 4);
                    }
                    piVar1 = (int *)(lVar10 * uVar23 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = lVar13 * uVar23 + local_300._24_8_;
                  }
                  else {
                    lVar10 = *local_250;
                    piVar1 = (int *)(lVar10 * lVar21 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar13 = *(long *)local_300._80_8_;
                    uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + uVar20 * 4);
                    piVar1 = (int *)(lVar10 * uVar23 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = lVar13 * uVar23 + local_300._24_8_;
                  }
                }
                else {
                  piVar1 = (int *)(lVar16 + -4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar17 + -1 + uVar20) == '\0') {
                    piVar1 = (int *)(lVar18 + -4 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar19 + -1 + uVar20) == '\0') goto LAB_0018b0d5;
                    if (uVar23 != 0) {
                      lVar18 = lVar10 * lVar15 + local_1c0;
                      piVar1 = (int *)(lVar18 + uVar9 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar19 = lVar13 * lVar15 + local_238._24_8_;
                      if (*(char *)(uVar9 + lVar19) == '\0') goto LAB_0018b713;
                      piVar1 = (int *)(lVar16 + -8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar17 + -2 + uVar20) == '\0') goto LAB_0018bf2d;
                      piVar1 = (int *)(lVar18 + -4 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar19 + -1 + uVar20) != '\0') {
                        piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                                     ) != '\0') goto LAB_0018b2fa;
                        piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_
                                     ) == '\0') goto LAB_0018b8f5;
                        goto LAB_0018b339;
                      }
                      piVar1 = (int *)(lVar18 + -8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar19 + -2 + uVar20) != '\0') {
                        lVar16 = local_1c0 + lVar10 * lVar21;
                        piVar1 = (int *)(lVar16 + -4 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar10 = local_238._24_8_ + lVar13 * lVar21;
                        if (*(char *)((uVar20 - 1) + lVar10) == '\0') goto LAB_0018bf8e;
                        piVar1 = (int *)(lVar18 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar19 + uVar20) != '\0') {
                          lVar10 = *local_250 * uVar23 + local_288;
                          piVar1 = (int *)(lVar10 + -8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar8 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ +
                                            -8 + uVar20 * 4);
                          piVar1 = (int *)(lVar10 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                          goto LAB_0018b397;
                        }
                        piVar1 = (int *)(lVar16 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar10 + uVar20) == '\0') {
                          lVar10 = *local_250;
                          piVar1 = (int *)(lVar10 * lVar21 + local_288 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar13 = *(long *)local_300._80_8_;
                          uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + uVar20 * 4);
                          goto LAB_0018c3d7;
                        }
LAB_0018c1dc:
                        lVar13 = *local_250 * uVar23 + local_288;
                        piVar1 = (int *)(lVar13 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                        uVar8 = *(uint *)(lVar10 + -8 + uVar20 * 4);
                        piVar1 = (int *)(lVar13 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        goto LAB_0018b397;
                      }
LAB_0018bf8e:
                      lVar10 = *local_250;
                      piVar1 = (int *)(lVar10 * lVar21 + local_288 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar13 = *(long *)local_300._80_8_;
                      uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + uVar20 * 4);
LAB_0018c1ac:
                      piVar1 = (int *)(lVar10 * uVar23 + local_288 + -8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(lVar13 * uVar23 + local_300._24_8_ + -8 + uVar20 * 4);
                      goto LAB_0018b6d6;
                    }
LAB_0018b713:
                    if ((uVar23 != 0) && ((long)(uVar20 + 2) < lVar12)) {
                      lVar18 = lVar10 * lVar15 + local_1c0;
                      piVar1 = (int *)(lVar18 + 8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar19 = lVar13 * lVar15 + local_238._24_8_;
                      if (*(char *)(uVar20 + 2 + lVar19) == '\0') goto LAB_0018b7f4;
                      lVar11 = local_1c0 + lVar10 * lVar21;
                      piVar1 = (int *)(lVar11 + uVar9 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar10 = local_238._24_8_ + lVar13 * lVar21;
                      if (*(char *)(uVar9 + lVar10) == '\0') {
                        piVar1 = (int *)(lVar18 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_0018bd20;
                        piVar1 = (int *)(lVar16 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if ((*(char *)(lVar17 + -2 + uVar20) == '\0') ||
                           ((piVar1 = (int *)(lVar18 + -4 + uVar20 * 4), *piVar1 = *piVar1 + 1,
                            *(char *)(lVar19 + -1 + uVar20) == '\0' &&
                            ((piVar1 = (int *)(lVar18 + -8 + uVar20 * 4), *piVar1 = *piVar1 + 1,
                             *(char *)(lVar19 + -2 + uVar20) == '\0' ||
                             (piVar1 = (int *)(lVar11 + -4 + uVar20 * 4), *piVar1 = *piVar1 + 1,
                             *(char *)(lVar10 + -1 + uVar20) == '\0')))))) {
                          lVar10 = *local_250 * lVar21 + local_288;
                          piVar1 = (int *)(lVar10 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar13 = *(long *)local_300._80_8_ * lVar21 + local_300._24_8_;
                          uVar8 = *(uint *)(lVar13 + uVar20 * 4);
                          piVar1 = (int *)(lVar10 + 8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar14 = *(uint *)(lVar13 + 8 + uVar20 * 4);
                          goto LAB_0018c2bd;
                        }
                        lVar10 = *local_250;
LAB_0018c188:
                        piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar13 = *(long *)local_300._80_8_;
                        uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + 8 + uVar20 * 4);
                        goto LAB_0018c1ac;
                      }
                      piVar1 = (int *)(lVar16 + -8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar17 + -2 + uVar20) != '\0') {
                        piVar1 = (int *)(lVar18 + -4 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if ((*(char *)(lVar19 + -1 + uVar20) == '\0') &&
                           ((piVar1 = (int *)(lVar18 + -8 + uVar20 * 4), *piVar1 = *piVar1 + 1,
                            *(char *)(lVar19 + -2 + uVar20) == '\0' ||
                            (piVar1 = (int *)(lVar11 + -4 + uVar20 * 4), *piVar1 = *piVar1 + 1,
                            *(char *)(lVar10 + -1 + uVar20) == '\0')))) {
                          lVar10 = *local_250;
                          goto LAB_0018c188;
                        }
                        piVar1 = (int *)(lVar18 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar19 + uVar20) == '\0') {
                          piVar1 = (int *)(lVar11 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar10 + uVar20) == '\0') {
                            lVar10 = *local_250;
                            piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar13 = *(long *)local_300._80_8_;
                            uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + 8 + uVar20 * 4);
LAB_0018c3d7:
                            piVar1 = (int *)(lVar10 * uVar23 + local_288 + -8 + uVar20 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar14 = *(uint *)(lVar13 * uVar23 + local_300._24_8_ + -8 + uVar20 * 4)
                            ;
                            goto LAB_0018c13f;
                          }
                          goto LAB_0018c1dc;
                        }
LAB_0018bef2:
                        lVar13 = *local_250 * uVar23 + local_288;
                        piVar1 = (int *)(lVar13 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                        uVar8 = *(uint *)(lVar10 + -8 + uVar20 * 4);
                        piVar1 = (int *)(lVar13 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        goto LAB_0018b397;
                      }
LAB_0018bd20:
                      lVar10 = *local_250;
                      piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar13 = *(long *)local_300._80_8_;
                      uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + 8 + uVar20 * 4);
LAB_0018bf6c:
                      piVar1 = (int *)(lVar10 * uVar23 + local_288 + -8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar8 = UFPC::MemMerge(uVar8,*(uint *)(lVar13 * uVar23 + local_300._24_8_ + -8
                                                            + uVar20 * 4));
                      goto LAB_0018b6e6;
                    }
LAB_0018b7f4:
                    if (uVar23 != 0) {
                      lVar18 = lVar10 * lVar15 + local_1c0;
                      piVar1 = (int *)(lVar18 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar19 = lVar13 * lVar15 + local_238._24_8_;
                      if (*(char *)(uVar20 + lVar19) != '\0') {
                        piVar1 = (int *)(lVar16 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar17 + -2 + uVar20) != '\0') {
                          piVar1 = (int *)(lVar18 + -4 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar19 + -1 + uVar20) != '\0') goto LAB_0018b83b;
                          piVar1 = (int *)(lVar18 + -8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar19 + -2 + uVar20) != '\0') {
                            piVar1 = (int *)(local_1c0 + lVar10 * lVar21 + -4 + uVar20 * 4);
                            *piVar1 = *piVar1 + 1;
                            if (*(char *)((uVar20 - 1) + local_238._24_8_ + lVar13 * lVar21) == '\0'
                               ) goto LAB_0018bf8e;
                            goto LAB_0018bef2;
                          }
                        }
LAB_0018bf2d:
                        lVar10 = *local_250;
                        piVar1 = (int *)(lVar10 * lVar21 + local_288 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar13 = *(long *)local_300._80_8_;
                        uVar8 = *(uint *)(lVar13 * lVar21 + local_300._24_8_ + uVar20 * 4);
                        goto LAB_0018bf6c;
                      }
                    }
LAB_0018b83b:
                    lVar13 = *local_250 * uVar23 + local_288;
                    piVar1 = (int *)(lVar13 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                    uVar8 = *(uint *)(lVar10 + -8 + uVar20 * 4);
                    piVar1 = (int *)(lVar13 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  else {
                    if ((uVar23 == 0) ||
                       (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar9 * 4),
                       *piVar1 = *piVar1 + 1,
                       *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) ==
                       '\0')) {
                      if ((uVar23 != 0) &&
                         (((long)(uVar20 + 2) < lVar12 &&
                          (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + 8 + uVar20 * 4),
                          *piVar1 = *piVar1 + 1,
                          *(char *)(uVar20 + 2 +
                                   *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')))
                         ) {
                        piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar9 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                            == '\0') {
                          piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ +
                                            8 + uVar20 * 4);
                          piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar14 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ +
                                             -8 + uVar20 * 4);
LAB_0018bc19:
                          uVar8 = UFPC::MemMerge(uVar8,uVar14);
                          goto LAB_0018b373;
                        }
                        piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                                     ) == '\0') {
                          piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar10 = *(long *)local_238._80_8_;
                          goto LAB_0018aa84;
                        }
                      }
                    }
                    else {
                      piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                          == '\0') {
                        piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar10 = *(long *)local_238._80_8_;
                        goto LAB_0018a0b0;
                      }
                    }
                    piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                                     uVar20 * 4);
LAB_0018b5a4:
                    piVar1 = (int *)(*local_250 * uVar23 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                  }
                }
                goto LAB_0018b397;
              }
              if ((uVar20 != 0) &&
                 ((piVar1 = (int *)(*local_188 * uVar22 + local_1c0 + -4 + uVar20 * 4),
                  *piVar1 = *piVar1 + 1,
                  *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * uVar22 + local_238._24_8_) !=
                  '\0' || (piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -4 + uVar20 * 4),
                          *piVar1 = *piVar1 + 1,
                          *(char *)((uVar20 - 1) +
                                   *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) != '\0')))
                 ) goto LAB_0018b339;
            }
            else {
LAB_0018a22c:
              uVar9 = uVar20 | 1;
              if (lVar12 <= (long)uVar9) {
LAB_0018ab9b:
                piVar1 = (int *)(*local_250 * uVar23 + local_288 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
                uVar8 = 0;
                goto LAB_0018b397;
              }
              piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + uVar9 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar9 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) == '\0')
              {
                if ((local_170 <= uVar22) ||
                   (piVar1 = (int *)(*local_188 * uVar22 + local_1c0 + uVar9 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar9 + *(long *)local_238._80_8_ * uVar22 + local_238._24_8_) == '\0')
                   ) goto LAB_0018ab9b;
              }
              else {
                if ((uVar23 != 0) &&
                   (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar9 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')
                   ) goto LAB_0018a7f9;
                if ((long)(uVar20 + 2) < lVar12) {
                  if (uVar23 == 0) goto LAB_0018ac11;
                  piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + 2 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                      != '\0') {
                    piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) !=
                        '\0') goto LAB_0018a740;
                    goto LAB_0018a77b;
                  }
                }
                if ((uVar23 != 0) &&
                   (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0'
                   )) goto LAB_0018a7f9;
              }
            }
LAB_0018ac11:
            uVar8 = UFPC::length_;
            lVar10 = (long)(int)UFPC::length_;
            UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] =
                 UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10] + 1;
            UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10] = uVar8;
            uVar8 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
LAB_0018b373:
            piVar1 = (int *)(*local_250 * uVar23 + local_288 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
          }
          else {
            if (uVar20 == 0) {
LAB_0018a4f3:
              uVar9 = uVar20 | 1;
              if ((long)uVar9 < lVar12) {
                if ((uVar23 == 0) ||
                   (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar9 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0')
                   ) {
                  piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + uVar9 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(uVar9 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) ==
                       '\0') ||
                     (((uVar23 == 0 || (lVar12 <= (long)(uVar20 + 2))) ||
                      (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + 8 + uVar20 * 4),
                      *piVar1 = *piVar1 + 1,
                      *(char *)(uVar20 + 2 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                      == '\0')))) goto LAB_0018a7ba;
                  piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) ==
                      '\0') {
                    if ((uVar20 != 0) &&
                       (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4),
                       *piVar1 = *piVar1 + 1,
                       *(char *)((uVar20 - 1) +
                                *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')) {
                      piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar9 * 4);
                      *piVar1 = *piVar1 + 1;
                      if ((*(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                           == '\0') ||
                         (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4),
                         *piVar1 = *piVar1 + 1,
                         *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                         == '\0')) {
                        piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8
                                         + uVar20 * 4);
                        piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar14 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8
                                          + uVar20 * 4);
                        goto LAB_0018b6d6;
                      }
                      piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                                       uVar20 * 4);
                      goto LAB_0018b6e6;
                    }
                  }
                  else {
LAB_0018a740:
                    piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + (uVar20 | 1) * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((uVar20 | 1) +
                                 *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) == '\0') {
                      piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ +
                                       uVar20 * 4);
                      piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar14 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                                        uVar20 * 4);
                      goto LAB_0018c13f;
                    }
                  }
LAB_0018a77b:
                  piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                                   uVar20 * 4);
                }
                else {
                  piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((((*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                         != '\0') || (uVar20 == 0)) ||
                      (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4),
                      *piVar1 = *piVar1 + 1,
                      *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                               ) == '\0')) ||
                     (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                     '\0')) goto LAB_0018a7f9;
                  piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8 +
                                   uVar20 * 4);
                  piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar14 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ +
                                    uVar20 * 4);
LAB_0018c13f:
                  uVar8 = UFPC::MemMerge(uVar8,uVar14);
                }
              }
              else {
LAB_0018a7ba:
                if ((uVar23 == 0) ||
                   (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0'
                   )) {
                  if ((uVar23 == 0 || uVar20 == 0) ||
                     (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                     == '\0')) goto LAB_0018ac11;
                  piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = *(long *)local_300._80_8_ * lVar21;
                  goto LAB_0018b369;
                }
LAB_0018a7f9:
                piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + uVar20 * 4
                                 );
              }
              goto LAB_0018b373;
            }
            piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) ==
                '\0') {
              if ((local_170 <= uVar22) ||
                 (piVar1 = (int *)(*local_188 * uVar22 + local_1c0 + -4 + uVar20 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * uVar22 + local_238._24_8_) ==
                 '\0')) goto LAB_0018a4f3;
              uVar9 = uVar20 | 1;
              if ((long)uVar9 < lVar12) {
                if ((uVar23 == 0) ||
                   (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar9 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0')
                   ) {
                  piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + uVar9 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(uVar9 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) ==
                       '\0') || (lVar12 <= (long)(uVar20 + 2))) goto LAB_0018ae10;
                  if (uVar23 == 0) goto LAB_0018b339;
                  piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + 2 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                      == '\0') goto LAB_0018ae10;
                  piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = *local_188 * lVar15 + local_1c0;
                  if (*(char *)((uVar20 - 2) + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_
                               ) != '\0') {
                    piVar1 = (int *)(lVar10 + -4 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((uVar20 - 1) +
                                 *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0') {
                      piVar1 = (int *)(local_1c0 + *local_188 * lVar21 + uVar9 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar10 = *local_188 * lVar15 + local_1c0;
                      if (*(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                          == '\0') {
                        piVar1 = (int *)(lVar10 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                                     ) != '\0') {
                          piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -8 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)((uVar20 - 2) +
                                       *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) ==
                              '\0') {
                            piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar10 = *local_250;
                            uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_
                                             + uVar20 * 4);
                            goto LAB_0018c342;
                          }
                          piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + -4 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar2 = *(char *)((uVar20 - 1) +
                                           *(long *)local_238._80_8_ * lVar21 + local_238._24_8_);
                          goto joined_r0x0018bacd;
                        }
                      }
                      else {
                        piVar1 = (int *)(lVar10 + -8 + uVar20 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)((uVar20 - 2) +
                                     *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')
                        {
                          piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + -4 + uVar20 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar2 = *(char *)((uVar20 - 1) +
                                           *(long *)local_238._80_8_ * lVar21 + local_238._24_8_);
                          goto joined_r0x0018bcc6;
                        }
                      }
                    }
                    else {
                      piVar1 = (int *)(local_1c0 + *local_188 * lVar21 + uVar9 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar2 = *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 +
                                                local_238._24_8_);
joined_r0x0018bcc6:
                      if ((cVar2 != '\0') &&
                         ((piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4),
                          *piVar1 = *piVar1 + 1,
                          *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                          != '\0' ||
                          (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4),
                          *piVar1 = *piVar1 + 1,
                          *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                          != '\0')))) goto LAB_0018b339;
                    }
LAB_0018c0db:
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *local_250 * uVar23 + local_288;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                                     uVar20 * 4);
                    goto LAB_0018c124;
                  }
                  piVar1 = (int *)(lVar10 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) !=
                      '\0') {
                    piVar1 = (int *)(local_1c0 + *local_188 * lVar21 + uVar9 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar2 = *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                    ;
joined_r0x0018bacd:
                    if (cVar2 != '\0') goto LAB_0018bad3;
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *local_250;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ +
                                     uVar20 * 4);
LAB_0018c0bb:
                    piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar14 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                                      uVar20 * 4);
                    goto LAB_0018c2bd;
                  }
                  piVar1 = (int *)(local_1c0 + *local_188 * lVar15 + -4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                               ) == '\0') goto LAB_0018c0db;
                  piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar9 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                      '\0') {
                    piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                        '\0') goto LAB_0018bad3;
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *local_250;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8 +
                                     uVar20 * 4);
                    goto LAB_0018c0bb;
                  }
                  piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = *local_250;
                  uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8 +
                                   uVar20 * 4);
LAB_0018c342:
                  piVar1 = (int *)(lVar10 * lVar21 + local_288 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar8 = UFPC::MemMerge(uVar8,*(uint *)(*(long *)local_300._80_8_ * lVar21 +
                                                         local_300._24_8_ + 8 + uVar20 * 4));
                  piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar14 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                                    uVar20 * 4);
                  goto LAB_0018c13f;
                }
                piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -8 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *local_188 * lVar15 + local_1c0;
                if (*(char *)((uVar20 - 2) + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_)
                    == '\0') {
                  piVar1 = (int *)(lVar10 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) ==
                       '\0') &&
                     (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                     != '\0')) {
                    piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                        '\0') goto LAB_0018b674;
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8 +
                                     uVar20 * 4);
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar14 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ +
                                      uVar20 * 4);
LAB_0018c2bd:
                    uVar8 = UFPC::MemMerge(uVar8,uVar14);
                    piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar14 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                                      uVar20 * 4);
                    goto LAB_0018b6d6;
                  }
                }
                else {
                  piVar1 = (int *)(lVar10 + -4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = *local_188 * lVar15 + local_1c0;
                  if (*(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_
                               ) == '\0') {
                    piVar1 = (int *)(lVar10 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if ((*(char *)((uVar20 - 2) +
                                  *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0') ||
                       (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + -4 + uVar20 * 4),
                       *piVar1 = *piVar1 + 1,
                       *(char *)((uVar20 - 1) +
                                *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) == '\0'))
                    goto LAB_0018b8f5;
                    lVar10 = *local_188 * lVar15 + local_1c0;
                  }
                  piVar1 = (int *)(lVar10 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) !=
                       '\0') ||
                     (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                     '\0')) goto LAB_0018b339;
                }
LAB_0018b8f5:
                piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *local_250 * uVar23 + local_288;
                uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + uVar20 * 4
                                 );
LAB_0018c124:
                piVar1 = (int *)(lVar10 + -8 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                uVar14 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                                  uVar20 * 4);
                goto LAB_0018c13f;
              }
LAB_0018ae10:
              if (uVar23 != 0) {
                piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                    == '\0') {
                  if ((uVar23 != 0) &&
                     (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) !=
                     '\0')) {
                    piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((uVar20 - 2) +
                                 *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) != '\0')
                    goto LAB_0018b27c;
                    goto LAB_0018b8f5;
                  }
                }
                else {
                  piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((uVar20 - 2) + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_
                               ) == '\0') {
                    piVar1 = (int *)(*local_250 * lVar21 + local_288 + -8 + uVar20 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar10 = *local_250 * uVar23 + local_288;
                    uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + -8 +
                                     uVar20 * 4);
                    goto LAB_0018c124;
                  }
                }
              }
LAB_0018b339:
              piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar10 = *(long *)local_300._80_8_ * uVar23;
LAB_0018b369:
              uVar8 = *(uint *)(lVar10 + local_300._24_8_ + -8 + uVar20 * 4);
              goto LAB_0018b373;
            }
            uVar9 = uVar20 | 1;
            if (lVar12 <= (long)uVar9) goto LAB_0018b339;
            if ((uVar23 == 0) ||
               (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar9 * 4), *piVar1 = *piVar1 + 1
               , *(char *)(uVar9 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) == '\0'))
            {
              piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + uVar9 * 4);
              *piVar1 = *piVar1 + 1;
              if ((*(char *)(uVar9 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) == '\0')
                 || (((uVar23 == 0 || (lVar12 <= (long)(uVar20 + 2))) ||
                     (piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + 8 + uVar20 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)(uVar20 + 2 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                     == '\0')))) goto LAB_0018b339;
              piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar9 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar9 + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) == '\0')
              goto LAB_0018c0db;
              piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')
              goto LAB_0018b339;
              piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar10 = *(long *)local_238._80_8_;
LAB_0018aa84:
              if ((*(char *)(uVar20 + lVar10 * lVar21 + local_238._24_8_) != '\0') &&
                 ((piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4),
                  *piVar1 = *piVar1 + 1,
                  *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) !=
                  '\0' || ((piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -8 + uVar20 * 4),
                           *piVar1 = *piVar1 + 1,
                           *(char *)((uVar20 - 2) +
                                    *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0'
                           && (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + -4 + uVar20 * 4),
                              *piVar1 = *piVar1 + 1,
                              *(char *)((uVar20 - 1) +
                                       *(long *)local_238._80_8_ * lVar21 + local_238._24_8_) !=
                              '\0')))))) goto LAB_0018b2fa;
LAB_0018bad3:
              piVar1 = (int *)(*local_250 * lVar21 + local_288 + 8 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar10 = *local_250;
              uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + 8 +
                               uVar20 * 4);
LAB_0018b6bb:
              piVar1 = (int *)(lVar10 * uVar23 + local_288 + -8 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              uVar14 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                                uVar20 * 4);
LAB_0018b6d6:
              uVar8 = UFPC::MemMerge(uVar8,uVar14);
            }
            else {
              piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar20 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) != '\0')
              goto LAB_0018b339;
              piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar10 = *(long *)local_238._80_8_;
LAB_0018a0b0:
              if (*(char *)(uVar20 + lVar10 * lVar21 + local_238._24_8_) == '\0') {
LAB_0018b674:
                piVar1 = (int *)(*local_250 * lVar21 + local_288 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *local_250;
                uVar8 = *(uint *)(*(long *)local_300._80_8_ * lVar21 + local_300._24_8_ + uVar20 * 4
                                 );
                goto LAB_0018b6bb;
              }
              piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_) ==
                  '\0') {
LAB_0018b27c:
                piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -8 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                if ((*(char *)((uVar20 - 2) + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                     == '\0') ||
                   (piVar1 = (int *)(*local_188 * lVar21 + local_1c0 + -4 + uVar20 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((uVar20 - 1) + *(long *)local_238._80_8_ * lVar21 + local_238._24_8_)
                   == '\0')) goto LAB_0018b674;
              }
LAB_0018b2fa:
              piVar1 = (int *)(*local_250 * uVar23 + local_288 + -8 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              uVar8 = *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -8 +
                               uVar20 * 4);
            }
LAB_0018b6e6:
            piVar1 = (int *)(*local_250 * uVar23 + local_288 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            lVar10 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
          }
LAB_0018b397:
          *(uint *)(lVar10 + uVar20 * 4) = uVar8;
          uVar20 = uVar20 + 2;
        } while ((long)uVar20 < lVar12);
      }
      uVar23 = uVar23 + 2;
    } while (uVar23 < local_170);
  }
  uVar8 = UFPC::MemFlatten();
  (local_160->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
  if (0 < (int)local_170) {
    local_138 = local_288;
    local_140 = local_250;
    local_148 = local_300._24_8_;
    local_150 = (long *)local_300._80_8_;
    lVar15 = 1;
    uVar23 = 0;
    do {
      piVar6 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar3) {
        local_168 = uVar23 | 1;
        local_128 = UFPC::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_130 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_118 = *(long *)local_300._80_8_ * uVar23 + local_300._24_8_;
        local_120 = *local_250 * uVar23 + local_288;
        lVar21 = 1;
        do {
          piVar1 = (int *)(local_120 + -4 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar10 = (long)*(int *)(local_118 + -4 + lVar21 * 4);
          if (lVar10 < 1) {
            piVar1 = (int *)(*local_250 * uVar23 + local_288 + -4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -4 + lVar21 * 4)
                 = 0;
            if (lVar21 < lVar12) {
              piVar1 = (int *)(*local_250 * uVar23 + local_288 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + lVar21 * 4) =
                   0;
              if (local_168 < local_170) {
                piVar1 = (int *)(*local_250 * lVar15 + local_288 + -4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)
                 (*(long *)local_300._80_8_ * lVar15 + local_300._24_8_ + -4 + lVar21 * 4) = 0;
                piVar1 = (int *)(*local_250 * lVar15 + local_288 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_300._80_8_ * lVar15 + local_300._24_8_ + lVar21 * 4)
                     = 0;
              }
            }
            else if (local_168 < local_170) {
              piVar1 = (int *)(*local_250 * lVar15 + local_288 + -4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (*(long *)local_300._80_8_ * lVar15 + local_300._24_8_ + -4 + lVar21 * 4) = 0;
            }
          }
          else {
            piVar6[lVar10] = piVar6[lVar10] + 1;
            uVar8 = puVar5[lVar10];
            piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + -4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            uVar14 = uVar8;
            if (*(char *)(lVar21 + -1 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) ==
                '\0') {
              uVar14 = 0;
            }
            piVar1 = (int *)(*local_250 * uVar23 + local_288 + -4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + -4 + lVar21 * 4) =
                 uVar14;
            if (lVar21 < lVar12) {
              piVar1 = (int *)(*local_188 * uVar23 + local_1c0 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar14 = uVar8;
              if (*(char *)(lVar21 + *(long *)local_238._80_8_ * uVar23 + local_238._24_8_) == '\0')
              {
                uVar14 = 0;
              }
              piVar1 = (int *)(*local_250 * uVar23 + local_288 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_300._80_8_ * uVar23 + local_300._24_8_ + lVar21 * 4) = uVar14
              ;
              if (local_168 < local_170) {
                piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                uVar14 = uVar8;
                if (*(char *)(lVar21 + -1 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
                    == '\0') {
                  uVar14 = 0;
                }
                piVar1 = (int *)(*local_250 * lVar15 + local_288 + -4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_300._80_8_ * lVar15 + local_300._24_8_ + -4 + lVar21 * 4) =
                     uVar14;
                piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                cVar2 = *(char *)(lVar21 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_);
                piVar1 = (int *)(*local_250 * lVar15 + local_288 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                lVar10 = *(long *)local_300._80_8_ * lVar15 + local_300._24_8_;
                if (cVar2 == '\0') {
                  *(undefined4 *)(lVar10 + lVar21 * 4) = 0;
                }
                else {
                  *(uint *)(lVar10 + lVar21 * 4) = uVar8;
                }
              }
            }
            else if (local_168 < local_170) {
              piVar1 = (int *)(*local_188 * lVar15 + local_1c0 + -4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              cVar2 = *(char *)(lVar21 + -1 + *(long *)local_238._80_8_ * lVar15 + local_238._24_8_)
              ;
              piVar1 = (int *)(*local_250 * lVar15 + local_288 + -4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar10 = *(long *)local_300._80_8_ * lVar15 + local_300._24_8_;
              if (cVar2 == '\0') {
                *(undefined4 *)(lVar10 + -4 + lVar21 * 4) = 0;
              }
              else {
                *(uint *)(lVar10 + -4 + lVar21 * 4) = uVar8;
              }
            }
          }
          lVar10 = lVar21 + 1;
          lVar21 = lVar21 + 2;
        } while (lVar10 < lVar12);
      }
      uVar23 = uVar23 + 2;
      lVar15 = lVar15 + 2;
    } while (uVar23 < local_170);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar7 = local_158;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_158,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_1d0;
  cv::sum((_InputArray *)local_108);
  *(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_298;
  cv::sum((_InputArray *)local_108);
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar23 = 0;
  }
  else {
    lVar12 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar24 = 0.0;
    lVar15 = 0;
    do {
      dVar24 = dVar24 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
    uVar23 = (long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24;
  }
  (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = uVar23;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_300);
  cv::Mat::operator=(&((local_160->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_298);
  cv::Mat::~Mat((Mat *)(local_300 + 8));
  cv::Mat::~Mat(local_1d0);
  cv::Mat::~Mat((Mat *)(local_238 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img(r-2, c-1)>0
#define CONDITION_C r-2>=0 && img(r-2, c)>0
#define CONDITION_D c+1<w && r-2>=0 && img(r-2, c+1)>0
#define CONDITION_E c+2<w && r-2>=0 && img(r-2, c+2)>0

#define CONDITION_G c-2>=0 && r-1>=0 && img(r-1, c-2)>0
#define CONDITION_H c-1>=0 && r-1>=0 && img(r-1, c-1)>0
#define CONDITION_I r-1>=0 && img(r-1, c)>0
#define CONDITION_J c+1<w && r-1>=0 && img(r-1, c+1)>0
#define CONDITION_K c+2<w && r-1>=0 && img(r-1, c+2)>0

#define CONDITION_M c-2>=0 && img(r, c-2)>0
#define CONDITION_N c-1>=0 && img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P c+1<w && img(r,c+1)>0

#define CONDITION_R c-1>=0 && r+1<h && img(r+1, c-1)>0
#define CONDITION_S r+1<h && img(r+1, c)>0
#define CONDITION_T c+1<w && r+1<h && img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2); continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c); continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2); continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2)); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2)); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2)); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2)); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }